

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O3

void __thiscall icu_63::RegexMatcher::resetPreserveRegion(RegexMatcher *this)

{
  this->fMatchStart = 0;
  this->fMatchEnd = 0;
  this->fLastMatchEnd = -1;
  this->fAppendPosition = 0;
  this->fMatch = '\0';
  this->fHitEnd = '\0';
  this->fRequireEnd = '\0';
  this->fTime = 0;
  this->fTickCounter = 10000;
  return;
}

Assistant:

void RegexMatcher::resetPreserveRegion() {
    fMatchStart     = 0;
    fMatchEnd       = 0;
    fLastMatchEnd   = -1;
    fAppendPosition = 0;
    fMatch          = FALSE;
    fHitEnd         = FALSE;
    fRequireEnd     = FALSE;
    fTime           = 0;
    fTickCounter    = TIMER_INITIAL_VALUE;
    //resetStack(); // more expensive than it looks...
}